

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

void parout(void)

{
  short *psVar1;
  char cVar2;
  undefined2 uVar3;
  uint uVar4;
  Symbol *pSVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  Symbol *pSVar11;
  Item *pIVar12;
  Item *pIVar13;
  Item *pIVar14;
  List *pLVar15;
  List *pLVar16;
  ushort uVar17;
  char *pcVar18;
  List **ppLVar19;
  ulong uVar20;
  uint uVar21;
  undefined8 uVar22;
  char *pcVar23;
  int j;
  long lVar24;
  Item *pIVar25;
  int iVar26;
  int i_1;
  int i;
  char *unaff_R15;
  long lVar27;
  bool bVar28;
  bool bVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  ulong local_c8;
  double d1_1;
  double d2;
  Item *local_a8;
  double d2_1;
  double d1;
  
  cvode_emit = 0;
  defs_list = newlist();
  pcVar18 = "nrn_cur, NULL, nrn_state";
  if (vectorize == 0) {
    pcVar18 = "nrn_cur, nrn_jacob, nrn_state";
  }
  brkpnt_str_ = "NULL, NULL, NULL";
  if (brkpnt_exists != 0) {
    brkpnt_str_ = pcVar18;
  }
  set_suffix();
  iVar8 = artificial_cell;
  if ((artificial_cell != 0) && (vectorize != 0)) {
    if ((thread_data_index == 0) && (toplocal_ == (List *)0x0)) {
      iVar8 = 1;
    }
    else {
      fwrite("Notice: ARTIFICIAL_CELL models that would require thread specific data are not thread safe.\n"
             ,0x5c,1,_stderr);
      vectorize = 0;
      iVar8 = artificial_cell;
    }
  }
  pIVar12 = net_receive_block_begin_;
  rsuffix = "";
  if (point_process == 0) {
    rsuffix = suffix;
  }
  else if ((iVar8 == 0) && (net_receive_ != 0)) {
    net_receive_buffering_ = 1;
    insertstr(net_receive_block_begin_,"\n#if NET_RECEIVE_BUFFERING");
    memcpy(buf,
           "\n#undef t\n#define t _nrb_t\nstatic inline void _net_receive_kernel(NrnThread*, double, Point_process*, int _weight_index, double _flag);\nvoid _net_buf_receive(NrnThread* _nt) {\n  if (!_nt->_ml_list) { return; }\n  Memb_list* _ml = _nt->_ml_list[_mechtype];\n  if (!_ml) { return; }\n  NetReceiveBuffer_t* _nrb = _ml->_net_receive_buffer;"
           ,0x14e);
    insertstr(pIVar12,buf);
    sprintf(buf,
            "\n  int _di;\n  int stream_id = _nt->stream_id;\n  Point_process* _pnt = _nt->pntprocs;\n  int _pnt_length = _nt->n_pntproc - _nrb->_pnt_offset;\n  int _displ_cnt = _nrb->_displ_cnt;\n  _PRAGMA_FOR_NETRECV_ACC_LOOP_ \n  for (_di = 0; _di < _displ_cnt; ++_di) {\n    int _inrb;\n    int _di0 = _nrb->_displ[_di];\n    int _di1 = _nrb->_displ[_di + 1];\n    for (_inrb = _di0; _inrb < _di1; ++_inrb) {\n      int _i = _nrb->_nrb_index[_inrb];\n      int _j = _nrb->_pnt_index[_i];\n      int _k = _nrb->_weight_index[_i];\n      double _nrt = _nrb->_nrb_t[_i];\n      double _nrflag = _nrb->_nrb_flag[_i];\n      _net_receive_kernel(nrn_threads, _nrt, _pnt + _j, _k, _nrflag);\n    }\n  }\n  #pragma acc wait(stream_id)\n  _nrb->_displ_cnt = 0;\n  _nrb->_cnt = 0;\n  /*printf(\"_net_buf_receive_%s  %%d\\n\", _nt->_id);*/\n"
            ,suffix);
    insertstr(pIVar12,buf);
    if (net_event_seen_ != 0 || net_send_seen_ != 0) {
      memcpy(buf,
             "\n  {\n  NetSendBuffer_t* _nsb = _ml->_net_send_buffer;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc update self(_nsb->_cnt) if(_nt->compute_gpu)\n  update_net_send_buffer_on_host(_nt, _nsb);\n#endif\n  int _i;\n  for (_i=0; _i < _nsb->_cnt; ++_i) {\n    net_sem_from_gpu(_nsb->_sendtype[_i], _nsb->_vdata_index[_i],\n      _nsb->_weight_index[_i], _nt->_id, _nsb->_pnt_index[_i],\n      _nsb->_nsb_t[_i], _nsb->_nsb_flag[_i]);\n  }\n  _nsb->_cnt = 0;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc update device(_nsb->_cnt) if (_nt->compute_gpu)\n#endif\n  }\n"
             ,0x24a);
      insertstr(pIVar12,buf);
    }
    insertstr(pIVar12,"\n}\n");
    if (net_event_seen_ != 0 || net_send_seen_ != 0) {
      memcpy(buf,
             "\nstatic void _net_send_buffering(NetSendBuffer_t* _nsb, int _sendtype, int _i_vdata, int _weight_index,\n int _ipnt, double _t, double _flag) {\n  int _i = 0;\n  #pragma acc atomic capture\n  {\n    _i = _nsb->_cnt++;\n  }\n#if !defined(_OPENACC)\n  if (_i >= _nsb->_size) {\n    _nsb->grow();\n  }\n#endif\n  if (_i < _nsb->_size) {\n    _nsb->_sendtype[_i] = _sendtype;\n    _nsb->_vdata_index[_i] = _i_vdata;\n    _nsb->_weight_index[_i] = _weight_index;\n    _nsb->_pnt_index[_i] = _ipnt;\n    _nsb->_nsb_t[_i] = _t;\n    _nsb->_nsb_flag[_i] = _flag;\n  }\n}\n"
             ,0x220);
      insertstr(pIVar12,buf);
    }
    unaff_R15 = buf;
    memcpy(buf,
           "\nvoid _net_receive (Point_process* _pnt, int _weight_index, double _lflag) {\n  NrnThread* _nt = nrn_threads + _pnt->_tid;\n  NetReceiveBuffer_t* _nrb = _nt->_ml_list[_mechtype]->_net_receive_buffer;\n  if (_nrb->_cnt >= _nrb->_size){\n    realloc_net_receive_buffer(_nt, _nt->_ml_list[_mechtype]);\n  }\n  _nrb->_pnt_index[_nrb->_cnt] = _pnt - _nt->pntprocs;\n  _nrb->_weight_index[_nrb->_cnt] = _weight_index;\n  _nrb->_nrb_t[_nrb->_cnt] = _nt->_t;\n  _nrb->_nrb_flag[_nrb->_cnt] = _lflag;\n  ++_nrb->_cnt;\n}\n"
           ,0x1f6);
    insertstr(pIVar12,buf);
    memcpy(buf,
           "\nstatic void _net_receive_kernel(NrnThread* nrn_threads, double _nrb_t, Point_process* _pnt, int _weight_index, double _lflag)\n#else\n"
           ,0x86);
    insertstr(pIVar12,buf);
    insertstr(net_receive_block_open_brace_,"\n#endif\n");
  }
  lappendstr(defs_list,
             "\n#include \"coreneuron/utils/randoms/nrnran123.h\"\n#include \"coreneuron/nrnoc/md1redef.h\"\n#include \"coreneuron/nrnconf.h\"\n#include \"coreneuron/sim/multicore.hpp\"\n#include \"coreneuron/nrniv/nrniv_decl.h\"\n#include \"coreneuron/utils/ivocvect.hpp\"\n#include \"coreneuron/utils/nrnoc_aux.hpp\"\n#include \"coreneuron/gpu/nrn_acc_manager.hpp\"\n#include \"coreneuron/sim/scopmath/newton_struct.h\"\n#include \"coreneuron/sim/scopmath/newton_thread.hpp\"\n#include \"coreneuron/sim/scopmath/sparse_thread.hpp\"\n#include \"coreneuron/sim/scopmath/ssimplic_thread.hpp\"\n#include \"coreneuron/nrnoc/md2redef.h\"\n#include \"coreneuron/mechanism/register_mech.hpp\"\n#if !NRNGPU\n#if !defined(DISABLE_HOC_EXP)\n#undef exp\n#define exp hoc_Exp\n#endif\n#endif\n"
            );
  if (use_bbcorepointer == '\x01') {
    lappendstr(defs_list,
               "#define _threadargsproto_namespace int _iml, int _cntml_padded, double* _p, coreneuron::Datum* _ppvar, coreneuron::ThreadDatum* _thread, coreneuron::NrnThread* _nt, coreneuron::Memb_list* _ml, double v\n"
              );
    lappendstr(defs_list,
               "static void bbcore_read(double *, int*, int*, int*, _threadargsproto_namespace);\n")
    ;
    lappendstr(defs_list,
               "static void bbcore_write(double *, int*, int*, int*, _threadargsproto_namespace);\n"
              );
  }
  lappendstr(defs_list,"namespace coreneuron {\n");
  if (vectorize == 0) {
    lappendstr(defs_list,"\n#undef LAYOUT\n#define LAYOUT 1\n#define _STRIDE 1\n");
  }
  else {
    lappendstr(defs_list,
               "\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n#include <openacc.h>\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], nrn_ion_global_map[0:nrn_ion_global_map_size][0:ion_global_map_member_size], _nt[0:1] _thread_present_) if(_nt->compute_gpu)\")\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _nt[0:1], _ml[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_shadow_rhs[0:_nt->shadow_rhs_cnt], _vec_shadow_d[0:_nt->shadow_rhs_cnt], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1]) if(_nt->compute_gpu) async(stream_id)\")\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"acc parallel loop present(_pnt[0:_pnt_length], _nrb[0:1], _nt[0:1], nrn_threads[0:nrn_nthread]) if(_nt->compute_gpu) async(stream_id)\")\n#else\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"\")\n#endif\n \n#if !defined(LAYOUT)\n/* 1 means AoS, >1 means AoSoA, <= 0 means SOA */\n#define LAYOUT 1\n#endif\n#if LAYOUT >= 1\n#define _STRIDE LAYOUT\n#else\n#define _STRIDE _cntml_padded + _iml\n#endif\n"
              );
    if (protect_include_ == 0) {
      pcVar18 = 
      "\n\n#if defined(__ICC) || defined(__INTEL_COMPILER) || defined(__INTEL_LLVM_COMPILER)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ivdep\")\n#elif defined(__IBMC__) || defined(__IBMCPP__)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ibm independent_loop\")\n#elif defined(__PGI)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"vector\")\n#elif defined(_CRAYC)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"_CRI ivdep\")\n#elif defined(__clang__)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"clang loop vectorize(enable)\")\n#elif defined(__GNUC__) || defined(__GNUG__)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"GCC ivdep\")\n#else\n#define _PRAGMA_FOR_VECTOR_LOOP_\n#endif // _PRAGMA_FOR_VECTOR_LOOP_\n"
      ;
    }
    else {
      pcVar18 = "\n#define _PRAGMA_FOR_VECTOR_LOOP_\n";
    }
    unaff_R15 = (char *)insertstr(defs_list,pcVar18);
  }
  if (net_receive_buffering_ != 0) {
    lappendstr(defs_list,
               "\n\n#if !defined(NET_RECEIVE_BUFFERING)\n#define NET_RECEIVE_BUFFERING 1\n#endif\n")
    ;
  }
  sprintf(buf,
          "\n#define nrn_init _nrn_init_%s\n#define nrn_cur _nrn_cur_%s\n#define _nrn_current _nrn_current_%s\n#define nrn_jacob _nrn_jacob_%s\n#define nrn_state _nrn_state_%s\n#define initmodel initmodel_%s\n#define _net_receive _net_receive_%s\n#define _net_init _net_init_%s\n#define nrn_state_launcher nrn_state%s_launcher\n#define nrn_cur_launcher nrn_cur%s_launcher\n#define nrn_jacob_launcher nrn_jacob%s_launcher"
          ,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix);
  lappendstr(defs_list,buf);
  if (net_receive_buffering_ != 0) {
    sprintf(buf,
            "\n#if NET_RECEIVE_BUFFERING\n#define _net_buf_receive _net_buf_receive%s\nvoid _net_buf_receive(NrnThread*);\n#endif\n"
            ,suffix);
    lappendstr(defs_list,buf);
  }
  local_a8 = (Item *)unaff_R15;
  if (watch_seen_ != 0) {
    sprintf(buf,"\n#define _nrn_watch_check _nrn_watch_check_%s",suffix);
    lappendstr(defs_list,buf);
  }
  for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
    pLVar16 = symlist[lVar24];
    pLVar15 = pLVar16;
    while (pLVar15 = pLVar15->next, pLVar15 != pLVar16) {
      pIVar12 = (pLVar15->element).itm;
      if ((pIVar12->itemtype == 0x13e) && (((ulong)pIVar12->element & 0x680) != 0)) {
        sprintf(buf,"\n#define %s %s%s",pIVar12[2].element.itm);
        lappendstr(defs_list,buf);
        pLVar16 = symlist[lVar24];
      }
    }
  }
  lappendstr(defs_list,"\n");
  lappendstr(defs_list,
             "\n#undef _threadargscomma_\n#undef _threadargsprotocomma_\n#undef _threadargs_\n#undef _threadargsproto_\n"
            );
  pcVar18 = 
  "\n#define _threadargscomma_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v,\n#define _threadargsprotocomma_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v,\n#define _threadargs_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v\n#define _threadargsproto_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v\n"
  ;
  if (vectorize == 0) {
    pcVar18 = 
    "\n#define _threadargscomma_ /**/\n#define _threadargsprotocomma_ /**/\n#define _threadargs_ /**/\n#define _threadargsproto_ /**/\n"
    ;
  }
  lappendstr(defs_list,pcVar18);
  lappendstr(defs_list,
             "\t/*SUPPRESS 761*/\n\t/*SUPPRESS 762*/\n\t/*SUPPRESS 763*/\n\t/*SUPPRESS 765*/\n\t");
  if (vectorize == 0) {
    builtin_strncpy(buf + 0x20,"*_ppvar;\n",10);
    buf[0x10] = 'p';
    buf[0x11] = ';';
    builtin_strncpy(buf + 0x1a,"Datum ",6);
    uVar30._0_1_ = 's';
    uVar30._1_1_ = 't';
    uVar30._2_1_ = 'a';
    uVar30._3_1_ = 't';
    uVar31._0_1_ = 'i';
    uVar31._1_1_ = 'c';
    uVar31._2_1_ = ' ';
    uVar31._3_1_ = 'd';
    uVar32._0_1_ = 'o';
    uVar32._1_1_ = 'u';
    uVar32._2_1_ = 'b';
    uVar32._3_1_ = 'l';
    uVar33._0_1_ = 'e';
    uVar33._1_1_ = ' ';
    uVar33._2_1_ = '*';
    uVar33._3_1_ = '_';
  }
  else {
    builtin_strncpy(buf + 0x20,"_ppvar. */\n",0xc);
    buf[0x10] = 'N';
    buf[0x11] = 'o';
    builtin_strncpy(buf + 0x1a,"_p or ",6);
    uVar30._0_1_ = '/';
    uVar30._1_1_ = '*';
    uVar30._2_1_ = ' ';
    uVar30._3_1_ = 'T';
    uVar31._0_1_ = 'h';
    uVar31._1_1_ = 'r';
    uVar31._2_1_ = 'e';
    uVar31._3_1_ = 'a';
    uVar32._0_1_ = 'd';
    uVar32._1_1_ = ' ';
    uVar32._2_1_ = 's';
    uVar32._3_1_ = 'a';
    uVar33._0_1_ = 'f';
    uVar33._1_1_ = 'e';
    uVar33._2_1_ = '.';
    uVar33._3_1_ = ' ';
  }
  builtin_strncpy(buf + 0x12," static ",8);
  buf[4] = (char)uVar31;
  buf[5] = SUB41(uVar31,1);
  buf[6] = SUB41(uVar31,2);
  buf[7] = SUB41(uVar31,3);
  buf[0] = (char)uVar30;
  buf[1] = SUB41(uVar30,1);
  buf[2] = SUB41(uVar30,2);
  buf[3] = SUB41(uVar30,3);
  buf._8_2_ = (undefined2)uVar32;
  buf._10_2_ = SUB42(uVar32,2);
  buf._12_2_ = (undefined2)uVar33;
  buf._14_2_ = SUB42(uVar33,2);
  lappendstr(defs_list,buf);
  pSVar11 = lookup("diam");
  if (pSVar11 != (Symbol *)0x0) {
    if ((pSVar11->nrntype & 0x48U) != 0) {
      diag(pSVar11->name," cannot be a RANGE or GLOBAL variable for this mechanism");
    }
    pSVar11->nrntype = pSVar11->nrntype | 0x110;
    diamdec = 1;
  }
  pSVar11 = lookup("area");
  if (pSVar11 != (Symbol *)0x0) {
    if ((pSVar11->nrntype & 0x48U) != 0) {
      diag(pSVar11->name," cannot be a RANGE or GLOBAL variable for this mechanism");
    }
    pSVar11->nrntype = pSVar11->nrntype | 0x110;
    areadec = 1;
  }
  iVar8 = vectorize;
  pSVar11 = ifnew_install("v");
  uVar17 = 0x100;
  if (iVar8 == 0) {
    uVar3 = pSVar11->nrntype;
    uVar17 = uVar3 | 0x180;
  }
  pSVar11->nrntype = uVar17;
  pSVar11 = ifnew_install("t");
  pSVar11->nrntype = pSVar11->nrntype | 0x101;
  pSVar11 = ifnew_install("dt");
  pSVar11->nrntype = pSVar11->nrntype | 0x101;
  pIVar12 = lappendstr(defs_list,"\n#define t nrn_threads->_t\n#define dt nrn_threads->_dt\n");
  vectorize_substitute(pIVar12,"\n#define t _nt->_t\n#define dt _nt->_dt\n");
  pSVar11 = lookup("usetable");
  if (pSVar11 != (Symbol *)0x0) {
    pSVar11->nrntype = pSVar11->nrntype | 0x140;
  }
  pSVar11 = lookup("celsius");
  if (pSVar11 != (Symbol *)0x0) {
    pSVar11->nrntype = pSVar11->nrntype | 0x101;
  }
  pSVar11 = lookup("celcius");
  pIVar12 = syminorder;
  if (pSVar11 != (Symbol *)0x0) {
    diag("celcius should be spelled celsius",(char *)0x0);
  }
  while (pIVar12 = pIVar12->next, pIVar12 != syminorder) {
    pSVar11 = (pIVar12->element).sym;
    if ((pSVar11->type & 0xfffeU) == 0x13e) {
      uVar20 = pSVar11->subtype;
      if (((uVar20 & 2) == 0) || (ppLVar19 = &rangeparm, (pSVar11->nrntype & 8) == 0)) {
        if ((uVar20 & 0x10) != 0) {
          *(byte *)&pSVar11->nrntype = (byte)pSVar11->nrntype | 8;
          ppLVar19 = &rangestate;
          goto LAB_00104ec4;
        }
        if (((uVar20 & 8) != 0) && (ppLVar19 = &rangedep, (pSVar11->nrntype & 8) != 0))
        goto LAB_00104ec4;
      }
      else {
LAB_00104ec4:
        lappendsym(*ppLVar19,pSVar11);
      }
      if (((pSVar11 != indepsym) && (pSVar11->nrntype == 0)) && ((pSVar11->subtype & 2) != 0)) {
        pSVar11->nrntype = (ushort)((pSVar11->usage & 1) == 0) * 0x40 + 0x140;
      }
    }
  }
  del_range(rangeparm);
  del_range(rangestate);
  del_range(rangedep);
  pLVar16 = syminorder;
  parraycount = 0;
  varcount = 0;
  pIVar12 = syminorder;
  while (pIVar12 = pIVar12->next, pIVar14 = rangeparm, pIVar12 != pLVar16) {
    ((pIVar12->element).sym)->used = -1;
  }
  while (pIVar14 = pIVar14->next, pIVar12 = rangedep, pIVar14 != rangeparm) {
    var_count((pIVar14->element).sym);
  }
  while (pIVar12 = pIVar12->next, pIVar14 = rangestate, pIVar12 != rangedep) {
    var_count((pIVar12->element).sym);
  }
  while (pIVar14 = pIVar14->next, pIVar13 = syminorder, pIVar12 = syminorder, pIVar14 != rangestate)
  {
    var_count((pIVar14->element).sym);
  }
  while (pIVar12 = pIVar12->next, pIVar12 != pIVar13) {
    pSVar11 = (pIVar12->element).sym;
    if (((pSVar11->nrntype & 0x100) == 0) && (pSVar11->used < 0)) {
      var_count(pSVar11);
      pIVar13 = syminorder;
    }
  }
  bVar28 = vectorize != 0;
  if (bVar28) {
    pSVar11 = ifnew_install("_v_unused");
    var_count(pSVar11);
  }
  uVar21 = (uint)bVar28;
  uVar20 = 2;
  if (brkpnt_exists != 0) {
    pcVar18 = "_g_unused";
    uVar6 = uVar20;
    if (vectorize == 0) {
      pcVar18 = "_g";
      uVar6 = (ulong)bVar28;
    }
    uVar21 = (uint)uVar6;
    pSVar11 = ifnew_install(pcVar18);
    var_count(pSVar11);
  }
  if ((debugging_ != 0) && (net_receive_ != 0)) {
    pSVar11 = ifnew_install("_tsav");
    var_count(pSVar11);
  }
  if (uVar21 != 0) {
    pcVar18 = "/**/";
    if (uVar21 == 2) {
      pcVar18 = "_g_unused = _g;";
    }
    sprintf(buf,
            "\n#ifndef NRN_PRCELLSTATE\n#define NRN_PRCELLSTATE 0\n#endif\n#if NRN_PRCELLSTATE\n#define _PRCELLSTATE_V _v_unused = _v;\n#define _PRCELLSTATE_G %s\n#else\n#define _PRCELLSTATE_V /**/\n#define _PRCELLSTATE_G /**/\n#endif\n"
            ,pcVar18);
    lappendstr(defs_list,buf);
  }
  if (point_process == 0) {
    uVar20 = 0;
    pIVar12 = useion;
  }
  else {
    pIVar12 = lappendstr(defs_list,"#define _nd_area  _nt_data[_ppvar[0*_STRIDE]]\n");
    pIVar12->itemtype = 0x102;
    ppvar_semantics(0,"area");
    ppvar_semantics(1,"pntproc");
    pIVar12 = useion;
  }
  while (pIVar12 = pIVar12->next, pIVar12 != useion) {
    if (uip == (List *)0x0) {
      uip = newlist();
      lappendstr(uip,"static void _update_ion_pointer(Datum* _ppvar) {\n");
    }
    pSVar11 = (pIVar12->element).sym;
    sprintf((char *)&d1,"%s_ion",pSVar11->name);
    pIVar12 = pIVar12->next;
    pIVar14 = (pIVar12->element).itm;
    pIVar13 = pIVar14;
    while (pIVar13 = pIVar13->next, pIVar13 != pIVar14) {
      psVar1 = &((pIVar13->element).sym)->nrntype;
      *psVar1 = *psVar1 | 0x200;
      iVar8 = (int)uVar20;
      sprintf(buf,"#define _ion_%s\t\t_nt_data[_ppvar[%d*_STRIDE]]\n",((pIVar13->element).sym)->name
              ,uVar20);
      pIVar14 = lappendstr(defs_list,buf);
      pIVar14->itemtype = 0x102;
      pcVar18 = pSVar11->name;
      iontype(((pIVar13->element).sym)->name,pcVar18);
      sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, %d);\n",pcVar18);
      ((pIVar13->element).sym)->ioncount_ = iVar8;
      ppvar_semantics(iVar8,(char *)&d1);
      uVar20 = (ulong)(iVar8 + 1);
      pIVar14 = (pIVar12->element).itm;
    }
    pIVar12 = pIVar12->next;
    pIVar14 = (pIVar12->element).itm;
    bVar28 = false;
    bVar29 = false;
    pIVar13 = pIVar14;
    while( true ) {
      pIVar13 = pIVar13->next;
      iVar8 = (int)uVar20;
      if (pIVar13 == pIVar14) break;
      pSVar5 = (pIVar13->element).sym;
      uVar21._0_2_ = pSVar5->nrntype;
      uVar21._2_2_ = pSVar5->assigned_to_;
      if ((uVar21 >> 9 & 1) == 0) {
        sprintf(buf,"#define _ion_%s\t_nt_data[_ppvar[%d*_STRIDE]]\n",pSVar5->name,uVar20);
        pIVar14 = lappendstr(defs_list,buf);
        pIVar14->itemtype = 0x102;
        pcVar18 = pSVar11->name;
        iontype(((pIVar13->element).sym)->name,pcVar18);
        sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, %d);\n",pcVar18);
        ((pIVar13->element).sym)->ioncount_ = iVar8;
        ppvar_semantics(iVar8,(char *)&d1);
        uVar20 = (ulong)(iVar8 + 1);
      }
      else {
        pSVar5->nrntype = (undefined2)uVar21 & 0xfdff;
      }
      iVar8 = iontype(((pIVar13->element).sym)->name,pSVar11->name);
      if (iVar8 == 3) {
        sprintf(buf,"#define _ion_di%sdv\t_nt_data[_ppvar[%d*_STRIDE]]\n",pSVar11->name,uVar20);
        pIVar14 = lappendstr(defs_list,buf);
        pIVar14->itemtype = 0x102;
        sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, 4);\n",pSVar11->name);
        ppvar_semantics((int)uVar20,(char *)&d1);
        uVar20 = (ulong)((int)uVar20 + 1);
        bVar29 = true;
      }
      if (iVar8 - 1U < 2) {
        bVar28 = true;
      }
      pIVar14 = (pIVar12->element).itm;
    }
    if (bVar28) {
      sprintf(buf,"#define _style_%s\t_ppvar[%d]\n",pSVar11->name);
      pIVar14 = lappendstr(defs_list,buf);
      pIVar14->itemtype = 0x102;
      sprintf(buf,"#%s",&d1);
      ppvar_semantics(iVar8,buf);
      uVar20 = (ulong)(iVar8 + 1);
    }
    pIVar12 = pIVar12->next;
    if ((!bVar29) && (ldifuslist != (List *)0x0)) {
      sprintf(buf,"#define _ion_di%sdv\t_nt_data[_ppvar[%d*_STRIDE]]\n",pSVar11->name,uVar20);
      pIVar14 = lappendstr(defs_list,buf);
      pIVar14->itemtype = 0x102;
      sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, 4);\n",pSVar11->name);
      ppvar_semantics((int)uVar20,(char *)&d1);
      uVar20 = (ulong)((int)uVar20 + 1);
    }
  }
  iVar8 = 0;
  pIVar12 = nrnpointers;
  while( true ) {
    pIVar12 = pIVar12->next;
    iVar26 = (int)uVar20;
    if (pIVar12 == nrnpointers) break;
    pSVar11 = (pIVar12->element).sym;
    uVar9._0_2_ = pSVar11->nrntype;
    uVar9._2_2_ = pSVar11->assigned_to_;
    if ((uVar9 >> 0xb & 1) != 0) {
      sprintf(buf,"#define %s\t_nt->_data[_ppvar[%d*_STRIDE]]\n",pSVar11->name);
      ppvar_semantics(iVar8 + iVar26,"pointer");
      uVar9 = (uint)(ushort)pSVar11->nrntype;
    }
    if ((uVar9 >> 0xd & 1) != 0) {
      sprintf(buf,"#define _p_%s\t_nt->_vdata[_ppvar[%d*_STRIDE]]\n",pSVar11->name);
      ppvar_semantics(iVar8 + iVar26,"bbcorepointer");
    }
    pSVar11->used = iVar26 + iVar8;
    pIVar14 = lappendstr(defs_list,buf);
    pIVar14->itemtype = 0x102;
    iVar8 = iVar8 + 1;
  }
  if (diamdec == 1) {
    sprintf(buf,"#define diam\t_nt->_data[_ppvar[%d*_STRIDE]]\n",(ulong)(uint)(iVar26 + iVar8));
    pIVar12 = lappendstr(defs_list,buf);
    pIVar12->itemtype = 0x102;
  }
  if (areadec == 1) {
    sprintf(buf,"#define area\t_nt->_data[_ppvar[%d*_STRIDE]]\n",
            (ulong)((uint)diamdec + iVar26 + iVar8));
    pIVar12 = lappendstr(defs_list,buf);
    pIVar12->itemtype = 0x102;
  }
  if (uip != (List *)0x0) {
    lappendstr(uip,"}\n");
  }
  lappendstr(defs_list,
             "\n#if MAC\n#if !defined(v)\n#define v _mlhv\n#endif\n#if !defined(h)\n#define h _mlhh\n#endif\n#endif\n"
            );
  lappendstr(defs_list,"static int hoc_nrnpointerindex = ");
  if (iVar8 == 0) {
    buf._4_4_ = SUB84(buf._0_8_,4) & 0xffffff00;
    builtin_strncpy(buf,"-1;\n",4);
  }
  else {
    sprintf(buf,"%d;\n",(ulong)(uint)((nrnpointers->next->element).sym)->used);
  }
  lappendstr(defs_list,buf);
  if (vectorize != 0) {
    lappendstr(defs_list,"static ThreadDatum* _extcall_thread;\n");
  }
  lappendstr(defs_list,"/* external NEURON variables */\n");
  bVar28 = false;
  bVar29 = false;
  for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
    pLVar16 = symlist[lVar24];
    pLVar15 = pLVar16;
    while (pLVar15 = pLVar15->next, pLVar15 != pLVar16) {
      pSVar11 = (pLVar15->element).sym;
      pcVar18 = pSVar11->name;
      iVar10 = strcmp(pcVar18,"nrn_ghk");
      if ((iVar10 == 0) && ((pSVar11->subtype & 0x8000) != 0)) {
        bVar28 = true;
        bVar29 = true;
      }
      bVar7 = bVar28;
      if ((pSVar11->nrntype & 1) != 0) {
        iVar10 = strcmp(pcVar18,"celsius");
        bVar7 = true;
        if (iVar10 != 0) {
          if (*pcVar18 == 't') {
            cVar2 = pcVar18[1];
joined_r0x001056f6:
            bVar7 = bVar28;
            if (cVar2 == '\0') goto LAB_00105786;
          }
          else if ((*pcVar18 == 'd') && (pcVar18[1] == 't')) {
            cVar2 = pcVar18[2];
            goto joined_r0x001056f6;
          }
          pcVar23 = "extern double* %s;\n";
          if ((pSVar11->subtype & 0x20) == 0) {
            pcVar23 = "extern double %s;\n";
          }
          sprintf(buf,pcVar23,pcVar18);
          lappendstr(defs_list,buf);
          pcVar18 = pSVar11->name;
          iVar10 = strcmp(pcVar18,"secondorder");
          if ((((iVar10 != 0) || (*pcVar18 != 'p')) || (pcVar18[1] != 'i')) ||
             (bVar7 = bVar28, pcVar18[2] != '\0')) {
            add_global_var("double",pcVar18,0,0,0,0);
            bVar7 = bVar28;
          }
        }
      }
LAB_00105786:
      bVar28 = bVar7;
      pLVar16 = symlist[lVar24];
    }
  }
  if (bVar28) {
    lappendstr(defs_list,"extern double celsius;\n");
    add_global_var("double","celsius",0,0,0,0);
  }
  if (bVar29) {
    lappendstr(defs_list,"#define nrn_ghk(v, ci, co, z) nrn_ghk(v, ci, co, z, celsius)\n");
  }
  lappendstr(defs_list,"#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"/* declaration of user functions */\n");
  for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
    pLVar16 = symlist[lVar24];
    pLVar15 = pLVar16;
    while (pLVar15 = pLVar15->next, pLVar15 != pLVar16) {
      if (((((pLVar15->element).sym)->subtype & 0xc0) != 0) &&
         (*((pLVar15->element).sym)->name != '_')) {
        pcVar18 = "static double _hoc_%s();\n";
        if (point_process == 0) {
          pcVar18 = "static void _hoc_%s(void);\n";
        }
        sprintf(buf,pcVar18);
        lappendstr(defs_list,buf);
        pLVar16 = symlist[lVar24];
      }
    }
  }
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  lappendstr(defs_list,"static int _mechtype;\n");
  if (point_process != 0) {
    lappendstr(defs_list,"static int _pointtype;\n");
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
    lappendstr(defs_list,
               "static void* _hoc_create_pnt(_ho) Object* _ho; { void* create_point_process();\n");
    lappendstr(defs_list,"return create_point_process(_pointtype, _ho);\n}\n");
    lappendstr(defs_list,"static void _hoc_destroy_pnt();\n");
    lappendstr(defs_list,
               "static double _hoc_loc_pnt(_vptr) void* _vptr; {double loc_point_process();\n");
    lappendstr(defs_list,"return loc_point_process(_pointtype, _vptr);\n}\n");
    lappendstr(defs_list,"static double _hoc_has_loc(_vptr) void* _vptr; {double has_loc_point();\n"
              );
    lappendstr(defs_list,"return has_loc_point(_vptr);\n}\n");
    lappendstr(defs_list,"static double _hoc_get_loc_pnt(_vptr)void* _vptr; {\n");
    lappendstr(defs_list,
               "double get_loc_point_process(); return (get_loc_point_process(_vptr));\n}\n");
    lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  }
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"/* connect user functions to hoc names */\n");
  lappendstr(defs_list,"static VoidFunc hoc_intfunc[] = {\n");
  if (point_process == 0) {
    sprintf(buf,"\"setdata_%s\", _hoc_setdata,\n",mechname);
  }
  else {
    lappendstr(defs_list,"0,0\n};\n");
    lappendstr(defs_list,"static Member_func _member_func[] = {\n");
    builtin_strncpy(buf,"\"loc\", _hoc_loc_pnt,\n",0x16);
    lappendstr(defs_list,buf);
    builtin_strncpy(buf,"\"has_loc\", _hoc_has_loc,\n",0x1a);
    lappendstr(defs_list,buf);
    builtin_strncpy(buf,"\"get_loc\", _hoc_get_loc_pnt,\n",0x1e);
  }
  lappendstr(defs_list,buf);
  for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
    pLVar16 = symlist[lVar24];
    pLVar15 = pLVar16;
    while (pLVar15 = pLVar15->next, pLVar15 != pLVar16) {
      if (((((pLVar15->element).sym)->subtype & 0xc0) != 0) &&
         (*((pLVar15->element).sym)->name != '_')) {
        sprintf(buf,"\"%s%s\", _hoc_%s,\n");
        lappendstr(defs_list,buf);
        pLVar16 = symlist[lVar24];
      }
    }
  }
  lappendstr(defs_list,"0, 0\n};\n");
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  if (suffix[0] != '\0') {
    for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
      pLVar16 = symlist[lVar24];
      pLVar15 = pLVar16;
      while (pLVar15 = pLVar15->next, pLVar15 != pLVar16) {
        if ((((pLVar15->element).sym)->subtype & 0x40) != 0) {
          sprintf(buf,"#define %s %s%s\n",((pLVar15->element).sym)->name);
          pIVar12 = lappendstr(defs_list,buf);
          pIVar12->itemtype = 0x102;
          pLVar16 = symlist[lVar24];
        }
      }
    }
  }
  for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
    pLVar16 = symlist[lVar24];
    pLVar15 = pLVar16;
    while (pLVar15 = pLVar15->next, pLVar15 != pLVar16) {
      pSVar11 = (pLVar15->element).sym;
      if ((pSVar11->subtype & 0x40) != 0) {
        if (artificial_cell == 0) {
          lappendstr(defs_list,"#pragma acc routine seq\n");
        }
        sprintf(buf,"inline double %s(",pSVar11->name);
        lappendstr(defs_list,buf);
        if ((vectorize != 0) && (pSVar11->no_threadargs == 0)) {
          pcVar18 = "_threadargsprotocomma_";
          if (pSVar11->varnum == 0) {
            pcVar18 = "_threadargsproto_";
          }
          lappendstr(defs_list,pcVar18);
        }
        for (iVar10 = 1; iVar10 + -1 < pSVar11->varnum; iVar10 = iVar10 + 1) {
          lappendstr(defs_list,"double");
          if (iVar10 < pSVar11->varnum) {
            lappendstr(defs_list,",");
          }
        }
        lappendstr(defs_list,");\n");
        pLVar16 = symlist[lVar24];
      }
    }
  }
  if (vectorize == 0) {
    bVar28 = true;
    iVar10 = 0;
  }
  else {
    iVar10 = check_tables_threads(defs_list);
    bVar28 = iVar10 == 0;
    iVar10 = vectorize;
  }
  if (toplocal_ != (List *)0x0 && iVar10 != 0) {
    uVar20 = 0;
    pIVar12 = toplocal_;
    while (pIVar12 = pIVar12->next, pIVar12 != toplocal_) {
      pSVar11 = (pIVar12->element).sym;
      if (pSVar11->assigned_to_ != 2) {
        if ((pSVar11->subtype & 0x20) == 0) {
          uVar20 = (ulong)((int)uVar20 + 1);
        }
        else {
          uVar20 = (ulong)(uint)((int)uVar20 + pSVar11->araydim);
        }
      }
    }
    sprintf(buf,"  _thread[%d]._pval = (double*)ecalloc(%d, sizeof(double));\n",
            (ulong)(uint)thread_data_index,uVar20);
    lappendstr(thread_mem_init_list,buf);
    sprintf(buf,"  free((void*)(_thread[%d]._pval));\n",(ulong)(uint)thread_data_index);
    lappendstr(thread_cleanup_list,buf);
    pIVar12 = toplocal_;
    while (pIVar12 = pIVar12->next, pIVar12 != toplocal_) {
      pSVar11 = (pIVar12->element).sym;
      pcVar18 = pSVar11->name;
      if (pSVar11->assigned_to_ == 2) {
        if ((pSVar11->subtype & 0x20U) == 0) {
          sprintf(buf,"static double %s;\n",pcVar18);
        }
        else {
          sprintf(buf,"static double %s[%d];\n",pcVar18,(ulong)(uint)pSVar11->araydim);
        }
      }
      else if ((pSVar11->subtype & 0x20U) == 0) {
        sprintf(buf,"#define %s _thread[%d]._pval[%d]\n",pcVar18,(ulong)(uint)thread_data_index);
      }
      else {
        sprintf(buf,"#define %s (_thread[%d]._pval + %d)\n",pcVar18,(ulong)(uint)thread_data_index);
      }
      lappendstr(defs_list,buf);
    }
    thread_data_index = thread_data_index + 1;
    iVar10 = vectorize;
  }
  uVar21 = 0;
  if (iVar10 != 0) {
    for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
      pIVar12 = symlist[lVar24];
      while (pIVar12 = pIVar12->next, pIVar12 != symlist[lVar24]) {
        pSVar11 = (pIVar12->element).sym;
        if (((pSVar11->nrntype & 0x40) != 0) && (pSVar11->assigned_to_ == 1)) {
          if ((pSVar11->subtype & 0x20) == 0) {
            uVar21 = uVar21 + 1;
          }
          else {
            uVar21 = uVar21 + pSVar11->araydim;
          }
        }
      }
    }
  }
  lappendstr(defs_list,"/* declare global and static user variables */\n");
  if (uVar21 != 0) {
    sprintf(buf,
            "static int _thread1data_inuse = 0;\nstatic double _thread1data[%d];\n#define _gth %d\n"
            ,(ulong)uVar21,(ulong)(uint)thread_data_index);
    lappendstr(defs_list,buf);
    sprintf(buf,
            " if (_thread1data_inuse) {_thread[_gth]._pval = (double*)ecalloc(%d, sizeof(double));\n }else{\n _thread[_gth]._pval = _thread1data; _thread1data_inuse = 1;\n }\n"
            ,(ulong)uVar21);
    lappendstr(thread_mem_init_list,buf);
    lappendstr(thread_cleanup_list,
               " if (_thread[_gth]._pval == _thread1data) {\n   _thread1data_inuse = 0;\n  }else{\n   free((void*)_thread[_gth]._pval);\n  }\n"
              );
    thread_data_index = thread_data_index + 1;
  }
  globals_update_list = newlist();
  local_c8 = 0;
  for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
    pLVar16 = symlist[lVar24];
    pLVar15 = pLVar16;
    while( true ) {
      pLVar15 = pLVar15->next;
      if (pLVar15 == pLVar16) break;
      pSVar11 = (pLVar15->element).sym;
      if ((pSVar11->nrntype & 0x40) != 0) {
        if ((vectorize == 0) || (pSVar11->assigned_to_ != 1)) {
          decode_ustr(pSVar11,&d1,&d2,buf);
          bVar29 = (pSVar11->subtype & 0x20) != 0;
          if (bVar29) {
            sprintf(buf,"static double %s%s[%d];\n",pSVar11->name,suffix,
                    (ulong)(uint)pSVar11->araydim);
            pcVar18 = pSVar11->name;
            iVar10 = pSVar11->araydim;
          }
          else {
            sprintf(buf,"static double %s%s = %g;\n",SUB84(d1,0),pSVar11->name);
            pcVar18 = pSVar11->name;
            iVar10 = 0;
          }
          add_global_var("double",pcVar18,1,(uint)bVar29,iVar10,0);
          lappendstr(defs_list,buf);
        }
        else {
          pcVar18 = "#define %s%s (_thread1data + %d)\n#define %s (_thread[_gth]._pval + %d)\n";
          if ((pSVar11->subtype & 0x20) == 0) {
            pcVar18 = "#define %s%s _thread1data[%d]\n#define %s _thread[_gth]._pval[%d]\n";
          }
          sprintf(buf,pcVar18,pSVar11->name,suffix,local_c8,pSVar11->name,local_c8);
          pIVar12 = lappendstr(defs_list,buf);
          pIVar12->itemtype = 0x102;
          if ((pSVar11->subtype & 0x20) == 0) {
            uVar21 = (int)local_c8 + 1;
          }
          else {
            uVar21 = (int)local_c8 + pSVar11->araydim;
          }
          local_c8 = (ulong)uVar21;
        }
      }
      pLVar16 = symlist[lVar24];
    }
  }
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"/* some parameters have upper and lower limits */\n");
  lappendstr(defs_list,"static HocParmLimits _hoc_parm_limits[] = {\n");
  lVar24 = 0x41;
LAB_00106195:
  if (lVar24 != 0x7b) {
    pLVar16 = symlist[lVar24];
    pLVar15 = pLVar16;
LAB_001061ad:
    do {
      pLVar15 = pLVar15->next;
      if (pLVar15 == pLVar16) goto LAB_00106280;
      pSVar11 = (pLVar15->element).sym;
      if ((pSVar11->subtype & 2) != 0) {
        d1_1 = 0.0;
        d2_1 = 0.0;
        pcVar18 = (pSVar11->u).str;
        if (pcVar18 == (char *)0x0) {
          __assert_fail("sym->u.str",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                        ,0x6e3,"int decode_limits()");
        }
        iVar10 = 0;
LAB_001061df:
        if (*pcVar18 == '\n') {
          iVar10 = iVar10 + 1;
          if (iVar10 == 3) {
            pcVar18 = pcVar18 + 1;
LAB_001061fc:
            iVar10 = __isoc99_sscanf(pcVar18,"%lf %lf\n",&d1_1,&d2_1);
            if (iVar10 == 2) {
              if (((pSVar11->nrntype & 0x40) == 0) && (point_process != 0)) {
                sprintf(buf,"\"%s\", %g, %g,\n",SUB84(d1_1,0),d2_1,pSVar11->name);
              }
              else {
                sprintf(buf,"\"%s%s\", %g, %g,\n",SUB84(d1_1,0),d2_1,pSVar11->name,suffix);
              }
              lappendstr(defs_list,buf);
            }
            pLVar16 = symlist[lVar24];
            goto LAB_001061ad;
          }
        }
        else if (*pcVar18 == '\0') goto LAB_001061fc;
        pcVar18 = pcVar18 + 1;
        goto LAB_001061df;
      }
    } while( true );
  }
  lappendstr(defs_list,"0,0,0\n};\n");
  units_reg();
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
    pLVar16 = symlist[lVar24];
    pLVar15 = pLVar16;
    while (pLVar15 = pLVar15->next, pLVar15 != pLVar16) {
      pSVar11 = (pLVar15->element).sym;
      if ((pSVar11->nrntype & 0x80) != 0) {
        decode_ustr(pSVar11,&d1,&d2,buf);
        bVar29 = (pSVar11->subtype & 0x20) != 0;
        if (bVar29) {
          sprintf(buf,"static double %s[%d];\n",pSVar11->name,(ulong)(uint)pSVar11->araydim);
          pcVar18 = pSVar11->name;
          iVar10 = pSVar11->araydim;
        }
        else {
          sprintf(buf,"static double %s = %g;\n",SUB84(d1,0),pSVar11->name);
          pcVar18 = pSVar11->name;
          iVar10 = 0;
        }
        add_global_var("double",pcVar18,0,(uint)bVar29,iVar10,0);
        lappendstr(defs_list,buf);
        pLVar16 = symlist[lVar24];
      }
    }
  }
  lappendstr(defs_list,"/* connect global user variables to hoc */\n");
  lappendstr(defs_list,"static DoubScal hoc_scdoub[] = {\n");
  pLVar15 = syminorder;
  pLVar16 = syminorder;
  while (pLVar16 = pLVar16->next, pLVar16 != pLVar15) {
    pSVar11 = (pLVar16->element).sym;
    if (((pSVar11->nrntype & 0x40) != 0) && ((pSVar11->subtype & 0x20) == 0)) {
      sprintf(buf,"\"%s%s\", &%s%s,\n",pSVar11->name,suffix,pSVar11->name,suffix);
      lappendstr(defs_list,buf);
      pLVar15 = syminorder;
    }
  }
  lappendstr(defs_list,"0,0\n};\n");
  lappendstr(defs_list,"static DoubVec hoc_vdoub[] = {\n");
  pLVar15 = syminorder;
  pLVar16 = syminorder;
  while (pLVar16 = pLVar16->next, pLVar16 != pLVar15) {
    pSVar11 = (pLVar16->element).sym;
    if (((pSVar11->nrntype & 0x40) != 0) && ((pSVar11->subtype & 0x20) != 0)) {
      sprintf(buf,"\"%s%s\", %s%s, %d,\n",pSVar11->name,suffix,pSVar11->name,suffix,
              (ulong)(uint)pSVar11->araydim);
      lappendstr(defs_list,buf);
      pLVar15 = syminorder;
    }
  }
  lappendstr(defs_list,"0,0,0\n};\n");
  lappendstr(defs_list,"static double _sav_indep;\n");
  if (0 < ba_index_) {
    lappendstr(defs_list,"static void _ba1(NrnThread*, Memb_list*, int)");
    for (uVar21 = 2; (int)uVar21 <= ba_index_; uVar21 = uVar21 + 1) {
      sprintf(buf,", _ba%d(NrnThread*, Memb_list*, int)",(ulong)uVar21);
      lappendstr(defs_list,buf);
    }
    lappendstr(defs_list,";\n");
  }
  lappendstr(defs_list,"static void _create_global_variables(NrnThread*, Memb_list*, int);\n");
  lappendstr(defs_list,"static void _destroy_global_variables(NrnThread*, Memb_list*, int);\n");
  lappendstr(defs_list,
             "static void nrn_alloc(double*, Datum*, int);\nvoid nrn_init(NrnThread*, Memb_list*, int);\nvoid nrn_state(NrnThread*, Memb_list*, int);\n"
            );
  if ((brkpnt_exists != 0) &&
     (lappendstr(defs_list,"void nrn_cur(NrnThread*, Memb_list*, int);\n"), vectorize == 0)) {
    lappendstr(defs_list,"void nrn_jacob(NrnThread*, Memb_list*, int);\n");
  }
  if (watch_seen_ != 0) {
    lappendstr(defs_list,"void _nrn_watch_check(NrnThread*, Memb_list*);\n");
  }
  iVar26 = iVar26 + iVar8;
  ppvar_cnt = (uint)areadec + (uint)diamdec + iVar26;
  if (net_send_seen_ != 0) {
    tqitem_index = ppvar_cnt;
    ppvar_semantics(ppvar_cnt,"netsend");
    ppvar_cnt = ppvar_cnt + 1;
  }
  if (watch_seen_ != 0) {
    watch_index = ppvar_cnt;
    for (iVar8 = 0; iVar8 < watch_seen_; iVar8 = iVar8 + 1) {
      ppvar_semantics(ppvar_cnt + iVar8,"watch");
    }
    ppvar_cnt = ppvar_cnt + watch_seen_;
    sprintf(buf,"\n#define _watch_array(arg) _ppvar[(arg + %d)*_STRIDE]",(ulong)(uint)watch_index);
    lappendstr(defs_list,buf);
    lappendstr(defs_list,"\n");
    sprintf(buf,
            "\n#define _nrn_watch_activate(_item)\\\n  if (_watch_rm == 0) {\\\n    int _i;\\\n    for (_i = 1; _i < %d; ++_i) {\\\n      _watch_array(_i) = 0;\\\n    }\\\n    _watch_rm = 1;\\\n  }\\\n  _watch_array(_item) = 2 +"
            ,(ulong)(uint)watch_seen_);
    lappendstr(defs_list,buf);
  }
  if (for_netcons_ != 0) {
    sprintf(buf,"\n#define _fnc_index %d\n",(ulong)(uint)ppvar_cnt);
    lappendstr(defs_list,buf);
    ppvar_semantics(ppvar_cnt,"fornetcon");
    ppvar_cnt = ppvar_cnt + 1;
  }
  if (point_process != 0) {
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
    lappendstr(defs_list,"static void _hoc_destroy_pnt(_vptr) void* _vptr; {\n");
    if ((for_netcons_ != 0 || watch_seen_ != 0) &&
       (lappendstr(defs_list,"  Prop* _prop = ((Point_process*)_vptr)->_prop;\n"), for_netcons_ != 0
       )) {
      memcpy(buf,"  if (_prop) { _nrn_free_fornetcon(&(_prop->dparam[_fnc_index]._pvoid));}\n",0x4b)
      ;
      lappendstr(defs_list,buf);
    }
    lappendstr(defs_list,"  destroy_point_process(_vptr);\n}\n");
    lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  }
  if (cvode_emit != 0) {
    cvode_ieq_index = ppvar_cnt;
    ppvar_semantics(ppvar_cnt,"cvodeieq");
    ppvar_cnt = ppvar_cnt + 1;
  }
  cvode_emit_interface();
  if (destructorfunc->next != destructorfunc) {
    if (point_process == 0) {
      diag("DESTRUCTOR only permitted for POINT_PROCESS",(char *)0x0);
    }
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\nstatic void _destructor(Prop*);\n#endif\n");
  }
  if (constructorfunc->next != constructorfunc) {
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\nstatic void _constructor(Prop*);\n#endif\n");
  }
  lappendstr(defs_list,"/* connect range variables in _p that hoc is supposed to know about */\n");
  lappendstr(defs_list,"static const char *_mechanism[] = {\n");
  sprintf(buf,"\"%s\",\n\"%s\",\n",nmodl_version_,mechname);
  lappendstr(defs_list,buf);
  pIVar12 = rangeparm;
  while (pIVar12 = pIVar12->next, pIVar12 != rangeparm) {
    pSVar11 = (pIVar12->element).sym;
    if ((pSVar11->subtype & 0x20) == 0) {
      sprintf(buf,"\"%s%s\",\n",pSVar11->name,rsuffix);
    }
    else {
      sprintf(buf,"\"%s%s[%d]\",\n",pSVar11->name,rsuffix,(ulong)(uint)pSVar11->araydim);
    }
    lappendstr(defs_list,buf);
  }
  lappendstr(defs_list,"0,\n");
  pIVar12 = rangedep;
  while (pIVar12 = pIVar12->next, pIVar12 != rangedep) {
    pSVar11 = (pIVar12->element).sym;
    if ((pSVar11->subtype & 0x20) == 0) {
      sprintf(buf,"\"%s%s\",\n",pSVar11->name,rsuffix);
    }
    else {
      sprintf(buf,"\"%s%s[%d]\",\n",pSVar11->name,rsuffix,(ulong)(uint)pSVar11->araydim);
    }
    lappendstr(defs_list,buf);
  }
  lappendstr(defs_list,"0,\n");
  pIVar12 = rangestate;
  while (pIVar12 = pIVar12->next, pIVar12 != rangestate) {
    pSVar11 = (pIVar12->element).sym;
    if ((pSVar11->subtype & 0x20) == 0) {
      sprintf(buf,"\"%s%s\",\n",pSVar11->name,rsuffix);
    }
    else {
      sprintf(buf,"\"%s%s[%d]\",\n",pSVar11->name,rsuffix,(ulong)(uint)pSVar11->araydim);
    }
    lappendstr(defs_list,buf);
  }
  lappendstr(defs_list,"0,\n");
  pIVar12 = nrnpointers;
  while (pIVar12 = pIVar12->next, pIVar12 != nrnpointers) {
    pSVar11 = (pIVar12->element).sym;
    if ((pSVar11->subtype & 0x20) == 0) {
      sprintf(buf,"\"%s%s\",\n",pSVar11->name,rsuffix);
    }
    else {
      sprintf(buf,"\"%s%s[%d]\",\n",pSVar11->name,rsuffix,(ulong)(uint)pSVar11->araydim);
    }
    lappendstr(defs_list,buf);
  }
  lappendstr(defs_list,"0};\n");
  if (diamdec == 1) {
    lappendstr(defs_list,"static Symbol* _morphology_sym;\n");
  }
  ppLVar19 = &useion;
  while (pLVar16 = (*ppLVar19)->next, pLVar16 != useion) {
    pSVar11 = (pLVar16->element).sym;
    sprintf(buf,"static int _%s_type;\n",pSVar11->name);
    lappendstr(defs_list,buf);
    if (ldifuslist != (List *)0x0) {
      sprintf(buf,"static int _type_i%s;\n",pSVar11->name);
      lappendstr(defs_list,buf);
    }
    ppLVar19 = &pLVar16->next->next->next;
  }
  lappendstr(globals_update_list,"struct _global_variables_t : public MemoryManaged {\n");
  lVar24 = 0;
  for (lVar27 = 0; lVar27 < global_variables_count; lVar27 = lVar27 + 1) {
    if (*(int *)((long)&global_variables->is_array + lVar24) == 0) {
      sprintf(buf,"  %s %s;\n",global_variables->type + lVar24);
    }
    else {
      sprintf(buf,"  %s %s[%d];\n",global_variables->type + lVar24,global_variables->name + lVar24,
              (ulong)*(uint *)((long)&global_variables->array_length + lVar24));
    }
    lappendstr(globals_update_list,buf);
    lVar24 = lVar24 + 0x2020;
  }
  lappendstr(globals_update_list,"};\n\n");
  lappendstr(globals_update_list,
             "\nstatic void _create_global_variables(NrnThread *_nt, Memb_list *_ml, int _type) {\n"
            );
  lappendstr(globals_update_list,"  assert(!_ml->global_variables);\n");
  lappendstr(globals_update_list,"  _ml->global_variables = new _global_variables_t{};\n");
  lappendstr(globals_update_list,"  _ml->global_variables_size = sizeof(_global_variables_t);\n");
  lappendstr(globals_update_list,"}\n");
  lappendstr(globals_update_list,
             "\nstatic void _destroy_global_variables(NrnThread *_nt, Memb_list *_ml, int _type) {\n"
            );
  lappendstr(globals_update_list,
             "  delete static_cast<_global_variables_t*>(_ml->global_variables);\n");
  lappendstr(globals_update_list,"  _ml->global_variables = nullptr;\n");
  lappendstr(globals_update_list,"  _ml->global_variables_size = 0;\n");
  lappendstr(globals_update_list,"}\n");
  lappendstr(globals_update_list,
             "\nstatic void _update_global_variables(NrnThread *_nt, Memb_list *_ml) {\n");
  lappendstr(globals_update_list,"  if(!_nt || !_ml) {\n");
  lappendstr(globals_update_list,"    return;\n");
  lappendstr(globals_update_list,"  }\n");
  lappendstr(globals_update_list,
             "  auto* const _global_variables = static_cast<_global_variables_t*>(_ml->global_variables);\n"
            );
  for (lVar24 = 0; lVar24 < global_variables_count; lVar24 = lVar24 + 1) {
    if (global_variables[lVar24].skip_initialisation == 0) {
      pcVar18 = suffix;
      if (global_variables[lVar24].is_nrnglobal == 0) {
        pcVar18 = "";
      }
      if (global_variables[lVar24].is_array == 0) {
        sprintf(buf,"  _global_variables->%s = %s%s;\n",global_variables[lVar24].name,
                global_variables[lVar24].name,pcVar18);
        lappendstr(globals_update_list,buf);
      }
      else {
        for (uVar20 = 0; (int)uVar20 < global_variables[lVar24].array_length;
            uVar20 = (ulong)((int)uVar20 + 1)) {
          sprintf(buf,"  _global_variables->%s[%d] = %s%s[%d];\n",global_variables[lVar24].name,
                  uVar20,global_variables[lVar24].name,pcVar18,uVar20);
          lappendstr(globals_update_list,buf);
        }
      }
    }
  }
  if (artificial_cell == 0) {
    lappendstr(globals_update_list,"#ifdef CORENEURON_ENABLE_GPU\n");
    lappendstr(globals_update_list,"  if (_nt->compute_gpu) {\n");
    lappendstr(globals_update_list,"      cnrn_target_update_on_device(_global_variables);\n");
    lappendstr(globals_update_list,"  }\n");
    lappendstr(globals_update_list,"#endif\n");
  }
  lappendstr(globals_update_list,"}\n\n");
  lVar24 = 0x10;
  for (lVar27 = 0; lVar27 < global_variables_count; lVar27 = lVar27 + 1) {
    sprintf(buf,"#define %s static_cast<_global_variables_t*>(_ml->global_variables)->%s\n",
            global_variables->type + lVar24);
    lappendstr(globals_update_list,buf);
    lVar24 = lVar24 + 0x2020;
  }
  lappendstr(globals_update_list,"\n");
  lappendstr(defs_list,"\nstatic void nrn_alloc(double* _p, Datum* _ppvar, int _type) {\n");
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"\t/*initialize range parameters*/\n");
  pLVar15 = rangeparm;
  pLVar16 = rangeparm;
  while (pLVar16 = pLVar16->next, pLVar16 != pLVar15) {
    pSVar11 = (pLVar16->element).sym;
    if ((pSVar11->subtype & 0x20) == 0) {
      decode_ustr(pSVar11,&d1,&d2,buf);
      sprintf(buf,"\t%s = %g;\n",SUB84(d1,0),pSVar11->name);
      lappendstr(defs_list,buf);
      pLVar15 = rangeparm;
    }
  }
  if (diamdec == 1) {
    ppvar_semantics(iVar26,"diam");
  }
  if (areadec == 1) {
    ppvar_semantics((uint)diamdec + iVar26,"area");
  }
  pIVar12 = useion;
  uVar21 = (uint)(point_process != 0) * 2;
  while( true ) {
    pIVar12 = pIVar12->next;
    if (pIVar12 == useion) break;
    pSVar11 = (pIVar12->element).sym;
    sprintf(buf,"prop_ion = need_memb(_%s_sym);\n",pSVar11->name);
    lappendstr(defs_list,buf);
    if (ldifuslist != (List *)0x0) {
      sprintf(buf," _type_i%s = prop_ion->_type;\n",pSVar11->name);
      lappendstr(defs_list,buf);
    }
    pIVar25 = pIVar12->next;
    pcVar18 = ((pIVar12->element).sym)->name;
    uVar9 = 0;
    uVar22 = 0;
    pIVar14 = (pIVar25->element).itm;
    pIVar13 = pIVar14;
    while (pIVar13 = pIVar13->next, pIVar13 != pIVar14) {
      iVar8 = iontype(((pIVar13->element).sym)->name,pcVar18);
      if (iVar8 == 0) {
        uVar22 = 1;
      }
      if (iVar8 - 1U < 2) {
        uVar9 = 1;
      }
      pIVar25 = pIVar12->next;
      pIVar14 = (pIVar25->element).itm;
    }
    pIVar14 = (pIVar25->next->element).itm;
    pIVar13 = pIVar14;
    while (pIVar13 = pIVar13->next, pIVar13 != pIVar14) {
      iVar8 = iontype(((pIVar13->element).sym)->name,pcVar18);
      pcVar23 = "nrn_check_conc_write(_prop, prop_ion, 1);\n";
      if (iVar8 == 1) {
LAB_001071c6:
        lappendstr(defs_list,pcVar23);
        uVar9 = 3;
      }
      else if (iVar8 == 2) {
        pcVar23 = "nrn_check_conc_write(_prop, prop_ion, 0);\n";
        goto LAB_001071c6;
      }
      if (iVar8 == 0) {
        uVar22 = 3;
      }
      pIVar25 = pIVar12->next;
      pIVar14 = (pIVar25->next->element).itm;
    }
    if (uVar9 != 0 || (int)uVar22 != 0) {
      sprintf(buf,"nrn_promote(prop_ion, %d, %d);\n",(ulong)uVar9,uVar22);
      lappendstr(defs_list,buf);
      pIVar25 = pIVar12->next;
    }
    pIVar12 = (pIVar25->element).itm;
    pIVar14 = pIVar12;
    uVar9 = uVar21;
    while (pIVar14 = pIVar14->next, pIVar14 != pIVar12) {
      psVar1 = &((pIVar14->element).sym)->nrntype;
      *psVar1 = *psVar1 | 0x200;
      uVar21 = iontype(((pIVar14->element).sym)->name,pSVar11->name);
      sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* %s */\n",(ulong)uVar9,(ulong)uVar21
              ,((pIVar14->element).sym)->name);
      lappendstr(defs_list,buf);
      uVar9 = uVar9 + 1;
      pIVar12 = (pIVar25->element).itm;
    }
    pIVar12 = pIVar25->next;
    bVar7 = false;
    bVar29 = false;
    pIVar14 = (pIVar12->element).itm;
    pIVar13 = pIVar14;
    while (pIVar13 = pIVar13->next, pIVar13 != pIVar14) {
      uVar21 = iontype(((pIVar13->element).sym)->name,pSVar11->name);
      pSVar5 = (pIVar13->element).sym;
      uVar4._0_2_ = pSVar5->nrntype;
      uVar4._2_2_ = pSVar5->assigned_to_;
      if ((uVar4 >> 9 & 1) == 0) {
        sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* %s */\n",(ulong)uVar9,
                (ulong)uVar21,pSVar5->name);
        lappendstr(defs_list,buf);
        uVar9 = uVar9 + 1;
      }
      else {
        pSVar5->nrntype = (undefined2)uVar4 & 0xfdff;
      }
      if (uVar21 == 3) {
        sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* _ion_di%sdv */\n",(ulong)uVar9,4,
                pSVar11->name);
        lappendstr(defs_list,buf);
        bVar7 = true;
        uVar9 = uVar9 + 1;
      }
      if (uVar21 - 1 < 2) {
        bVar29 = true;
      }
      pIVar14 = (pIVar12->element).itm;
    }
    uVar21 = uVar9;
    if (bVar29) {
      uVar21 = uVar9 + 1;
      sprintf(buf,"\t_ppvar[%d]._pvoid = (void*)(&(prop_ion->dparam[0]._i)); /* iontype for %s */\n"
              ,(ulong)uVar9,pSVar11->name);
      lappendstr(defs_list,buf);
    }
    pIVar12 = pIVar12->next;
    if ((!bVar7) && (ldifuslist != (List *)0x0)) {
      sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* _ion_di%sdv */\n",(ulong)uVar21,4,
              pSVar11->name);
      lappendstr(defs_list,buf);
      uVar21 = uVar21 + 1;
    }
  }
  lappendstr(defs_list,"\n#endif /* BBCORE */\n");
  if (constructorfunc->next != constructorfunc) {
    lappendstr(defs_list,
               "\n#if 0 /*BBCORE*/\nif (!nrn_point_prop_) {_constructor(_prop);}\n#endif\n");
    pcVar18 = 
    "\n#if 0 /*BBCORE*/\nstatic _constructor(_prop)\n\tProp *_prop; double* _p; Datum* _ppvar; ThreadDatum* _thread;\n{\n\t_thread = (Datum*)0;\n\t_p = _prop->param; _ppvar = _prop->dparam;\n{\n"
    ;
    if (vectorize == 0) {
      pcVar18 = 
      "\n#if 0 /*BBCORE*/\nstatic void _constructor(Prop* _prop) {\n\t_p = _prop->param; _ppvar = _prop->dparam;\n{\n"
      ;
    }
    lappendstr(procfunc,pcVar18);
    movelist(constructorfunc->next,constructorfunc->prev,procfunc);
    lappendstr(procfunc,"\n}\n}\n#endif /*BBCORE*/\n");
  }
  lappendstr(defs_list,"\n}\n");
  lappendstr(defs_list,"static void _initlists(Memb_list *_ml);\n");
  if (cvode_emit != 0) {
    lappendstr(defs_list," /* some states have an absolute tolerance */\n");
    lappendstr(defs_list,"static Symbol** _atollist;\n");
    lappendstr(defs_list,"static HocStateTolerance _hoc_state_tol[] = {\n");
    pIVar12 = rangestate;
LAB_00107579:
    pIVar12 = pIVar12->next;
    if (pIVar12 != rangestate) {
      pSVar11 = (pIVar12->element).sym;
      if ((pSVar11->subtype & 0x10) != 0) {
        pcVar18 = (pSVar11->u).str;
        iVar8 = 0;
LAB_00107599:
        if (*pcVar18 == '\n') {
          iVar8 = iVar8 + 1;
          if (iVar8 == 3) {
            pcVar18 = pcVar18 + 1;
LAB_001075b6:
            iVar8 = __isoc99_sscanf(pcVar18,"%lf\n",&d1_1);
            if (iVar8 == 1) {
              if (point_process == 0) {
                sprintf(buf,"\"%s%s\", %g,\n",SUB84(d1_1,0),pSVar11->name,suffix);
              }
              else {
                sprintf(buf,"\"%s\", %g,\n",SUB84(d1_1,0),pSVar11->name);
              }
              lappendstr(defs_list,buf);
            }
            goto LAB_00107579;
          }
        }
        else if (*pcVar18 == '\0') goto LAB_001075b6;
        pcVar18 = pcVar18 + 1;
        goto LAB_00107599;
      }
      goto LAB_00107579;
    }
    lappendstr(defs_list,"0,0\n};\n");
  }
  if (singlechan_ != 0) {
    sprintf(buf,"static _singlechan_declare%d();\n");
    lappendstr(defs_list,buf);
  }
  if (net_send_seen_ != 0) {
    if (net_receive_ == 0) {
      diag("can\'t use net_send if there is no NET_RECEIVE block",(char *)0x0);
    }
    sprintf(buf,"\n#define _tqitem &(_nt->_vdata[_ppvar[%d*_STRIDE]])\n",(ulong)(uint)tqitem_index);
    lappendstr(defs_list,buf);
    if (net_receive_buffering_ != 0) {
      sprintf(buf,
              "\n#if NET_RECEIVE_BUFFERING\n#undef _tqitem\n#define _tqitem _ppvar[%d*_STRIDE]\n#endif\n\n"
              ,(ulong)(uint)tqitem_index);
      lappendstr(defs_list,buf);
    }
    if (net_send_delivered_ != (Item *)0x0) {
      insertstr(net_send_delivered_,
                "\n#if !NET_RECEIVE_BUFFERING\n  if (_lflag == 1. ) {*(_tqitem) = 0;}\n#endif\n");
    }
  }
  if ((net_receive_ != 0) &&
     (lappendstr(defs_list,"void _net_receive(Point_process*, int, double);\n"),
     net_init_q1_ != (Item *)0x0)) {
    lappendstr(defs_list,"void _net_init(Point_process*, int, double);\n");
  }
  if ((vectorize != 0) &&
     (((thread_mem_init_list->next == thread_mem_init_list ||
       (lappendstr(defs_list,"static void _thread_mem_init(ThreadDatum*);\n"), vectorize != 0)) &&
      (thread_cleanup_list->next != thread_cleanup_list)))) {
    lappendstr(defs_list,"static void _thread_cleanup(ThreadDatum*);\n");
  }
  if (uip != (List *)0x0) {
    lappendstr(defs_list,"static void _update_ion_pointer(Datum*);\n");
  }
  sprintf(buf,"\n#define _psize %d\n#define _ppsize %d\n",(ulong)(uint)parraycount,
          (ulong)(uint)ppvar_cnt);
  lappendstr(defs_list,buf);
  sprintf(buf,"void _%s_reg() {\n\tint _vectorized = %d;\n",modbase,(ulong)(uint)vectorize);
  lappendstr(defs_list,buf);
  lappendstr(defs_list,"");
  if (suffix[0] != '\0') {
    lappendstr(defs_list,"_mechtype = nrn_get_mechtype(_mechanism[1]);\n");
    lappendstr(defs_list,"if (_mechtype == -1) return;\n");
    lappendstr(defs_list,"_nrn_layout_reg(_mechtype, LAYOUT);\n");
    ppLVar19 = &useion;
    while (pLVar16 = (*ppLVar19)->next, pLVar16 != useion) {
      sprintf(buf,"_%s_type = nrn_get_mechtype(\"%s_ion\");",((pLVar16->element).sym)->name);
      lappendstr(defs_list,buf);
      ppLVar19 = &pLVar16->next->next->next;
    }
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
    ppLVar19 = &useion;
    while (pLVar16 = (*ppLVar19)->next, pLVar16 != useion) {
      sprintf(buf,"\tion_reg(\"%s\", %s);\n",((pLVar16->element).sym)->name,
              (pLVar16->next->next->next->element).itm);
      lappendstr(defs_list,buf);
      ppLVar19 = &pLVar16->next->next->next;
    }
    if (diamdec == 1) {
      lappendstr(defs_list,"\t_morphology_sym = hoc_lookup(\"morphology\");\n");
    }
    ppLVar19 = &useion;
    while (pLVar16 = (*ppLVar19)->next, pLVar16 != useion) {
      sprintf(buf,"\t_%s_sym = hoc_lookup(\"%s_ion\");\n",((pLVar16->element).sym)->name);
      lappendstr(defs_list,buf);
      ppLVar19 = &pLVar16->next->next->next;
    }
    lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
    uVar21 = thread_data_index + 1;
    if (vectorize == 0) {
      uVar21 = 0;
    }
    if (point_process == 0) {
      sprintf(buf,
              " register_mech(_mechanism, nrn_alloc,%s, nrn_init, _create_global_variables, _destroy_global_variables, hoc_nrnpointerindex, %d);\n"
              ,brkpnt_str_,(ulong)uVar21);
      pcVar18 = buf;
LAB_00107a78:
      pIVar12 = local_a8;
      lappendstr(defs_list,pcVar18);
    }
    else {
      sprintf(buf,
              "\t_pointtype = point_register_mech(_mechanism,\n\t nrn_alloc,%s, nrn_init, _create_global_variables, _destroy_global_variables,\n\t hoc_nrnpointerindex,\n\t NULL/*_hoc_create_pnt*/, NULL/*_hoc_destroy_pnt*/, /*_member_func,*/\n\t %d);\n"
              ,brkpnt_str_,(ulong)uVar21);
      lappendstr(defs_list,buf);
      pIVar12 = local_a8;
      if (destructorfunc->next != destructorfunc) {
        pcVar18 = "    #if 0 /*BBCORE*/\n    register_destructor(_destructor);\n    #endif\n";
        goto LAB_00107a78;
      }
    }
    if (thread_data_index != 0 && vectorize != 0) {
      sprintf(buf," _extcall_thread = (ThreadDatum*)ecalloc(%d, sizeof(ThreadDatum));\n");
      lappendstr(defs_list,buf);
      if ((thread_mem_init_list->next != thread_mem_init_list) &&
         (lappendstr(defs_list," _thread_mem_init(_extcall_thread);\n"), (int)local_c8 != 0)) {
        lappendstr(defs_list," _thread1data_inuse = 0;\n");
      }
    }
    if (vectorize != 0) {
      insertstr(pIVar12,"\n#define _thread_present_ /**/");
      if (thread_data_index != 0) {
        sprintf(buf,", _thread[0:%d]");
        insertstr(pIVar12,buf);
      }
      insertstr(pIVar12,"\n");
      if (((vectorize != 0) &&
          ((thread_mem_init_list->next == thread_mem_init_list ||
           (lappendstr(defs_list,"    _nrn_thread_reg1(_mechtype, _thread_mem_init);\n"),
           vectorize != 0)))) && (thread_cleanup_list->next != thread_cleanup_list)) {
        lappendstr(defs_list,"    _nrn_thread_reg0(_mechtype, _thread_cleanup);\n");
      }
    }
    if (!bVar28) {
      lappendstr(defs_list,"    _nrn_thread_table_reg(_mechtype, _check_table_thread);\n");
    }
    if (use_bbcorepointer == '\x01') {
      lappendstr(defs_list,"  hoc_reg_bbcore_read(_mechtype, bbcore_read);\n");
      lappendstr(defs_list,"  hoc_reg_bbcore_write(_mechtype, bbcore_write);\n");
    }
    builtin_strncpy(buf," hoc_register_prop_size(_mechtype, _psize, _ppsize);\n",0x36);
    iVar8 = 0;
    lappendstr(defs_list,buf);
    pIVar12 = ppvar_semantics_;
    if (ppvar_semantics_ != (List *)0x0) {
      while (pIVar12 = pIVar12->next, pIVar12 != ppvar_semantics_) {
        sprintf(buf," hoc_register_dparam_semantics(_mechtype, %d, \"%s\");\n",
                (ulong)(uint)(int)pIVar12->itemtype,(pIVar12->element).itm);
        lappendstr(defs_list,buf);
      }
    }
    ppLVar19 = &useion;
    while (pLVar16 = (*ppLVar19)->next, pLVar16 != useion) {
      pIVar12 = pLVar16->next->next;
      pIVar14 = (pIVar12->element).itm;
      pIVar13 = pIVar14;
      while (pIVar13 = pIVar13->next, pIVar13 != pIVar14) {
        iVar26 = iontype(((pIVar13->element).sym)->name,((pLVar16->element).sym)->name);
        iVar8 = iVar8 + (uint)(iVar26 - 1U < 2);
        pIVar12 = pLVar16->next->next;
        pIVar14 = (pIVar12->element).itm;
      }
      ppLVar19 = &pIVar12->next;
    }
    if (iVar8 != 0) {
      lappendstr(defs_list,"\tnrn_writes_conc(_mechtype, 0);\n");
    }
    printf("cvode_emit=%d cvode_not_allowed=%d\n",(ulong)(uint)cvode_emit,
           (ulong)(uint)cvode_not_allowed);
    if (cvode_emit != 0) {
      lappendstr(defs_list,
                 "\thoc_register_cvode(_mechtype, _ode_count, _ode_map, _ode_spec, _ode_matsol);\n")
      ;
      lappendstr(defs_list,"\thoc_register_tolerance(_mechtype, _hoc_state_tol, &_atollist);\n");
      if (ion_synonym != (List *)0x0) {
        lappendstr(defs_list,"\thoc_register_synonym(_mechtype, _ode_synonym);\n");
      }
    }
    if (singlechan_ != 0) {
      sprintf(buf,"hoc_reg_singlechan(_mechtype, _singlechan_declare%d);\n");
      lappendstr(defs_list,buf);
    }
    if (artificial_cell != 0) {
      if ((((brkpnt_exists != 0) || (net_receive_ == 0)) || (nrnpointers->next != nrnpointers)) ||
         (useion->next != useion)) {
        puts(
            "Notice: ARTIFICIAL_CELL is a synonym for POINT_PROCESS which hints that it\nonly affects and is affected by discrete events. As such it is not\nlocated in a section and is not associated with an integrator"
            );
      }
      sprintf(buf,"add_nrn_artcell(_mechtype, %d);\n",(ulong)(uint)tqitem_index);
      lappendstr(defs_list,buf);
    }
    if (net_event_seen_ != 0) {
      lappendstr(defs_list,"add_nrn_has_net_event(_mechtype);\n");
    }
    if (watch_seen_ != 0) {
      lappendstr(defs_list,"hoc_register_watch_check(_nrn_watch_check, _mechtype);\n");
    }
    if ((net_receive_buffering_ != 0) &&
       (lappendstr(defs_list,
                   "\n#if NET_RECEIVE_BUFFERING\n  hoc_register_net_receive_buffering(_net_buf_receive, _mechtype);\n#endif\n"
                  ), net_event_seen_ != 0 || net_send_seen_ != 0)) {
      lappendstr(defs_list,
                 "\n#if NET_RECEIVE_BUFFERING\n  hoc_register_net_send_buffering(_mechtype);\n#endif\n"
                );
    }
    if (net_receive_ != 0) {
      pcVar18 = "set_pnt_receive(_mechtype, _net_receive, _net_init, %d);\n";
      if (net_init_q1_ == (Item *)0x0) {
        pcVar18 = "set_pnt_receive(_mechtype, _net_receive, nullptr, %d);\n";
      }
      sprintf(buf,pcVar18);
      lappendstr(defs_list,buf);
    }
    if (for_netcons_ != 0) {
      builtin_strncpy(buf + 0x20,"nc_index);\n",0xc);
      builtin_strncpy(buf + 0x10,"ns(_mechtype, _f",0x10);
      builtin_strncpy(buf,"add_nrn_fornetco",0x10);
      lappendstr(defs_list,buf);
    }
    pIVar12 = ba_list_;
    for (uVar21 = 1; (int)uVar21 <= ba_index_; uVar21 = uVar21 + 1) {
      pIVar12 = pIVar12->next;
      pLVar16 = get_ion_variables(0);
      if (pLVar16->next != pLVar16->prev) {
        move(pLVar16->next,pLVar16->prev,(pIVar12->element).itm);
        freelist((List **)pLVar16);
      }
      pIVar12 = pIVar12->next;
      pLVar16 = set_ion_variables(0);
      if (pLVar16->next != pLVar16->prev) {
        move(pLVar16->next,pLVar16->prev,(pIVar12->element).itm);
        freelist((List **)pLVar16);
      }
      pIVar12 = pIVar12->next;
      sprintf(buf,"\thoc_reg_ba(_mechtype, _ba%d, %s);\n",(ulong)uVar21,(pIVar12->element).itm);
      lappendstr(defs_list,buf);
    }
    if (ldifuslist != (List *)0x0) {
      lappendstr(defs_list,"\thoc_register_ldifus1(_difusfunc);\n");
      linsertstr(defs_list,"static void _difusfunc(ldifusfunc2_t, NrnThread*);\n");
    }
  }
  lappendstr(defs_list,"\thoc_register_var(hoc_scdoub, hoc_vdoub, NULL);\n");
  lappendstr(defs_list,"}\n");
  if (vectorize != 0) {
    if (thread_mem_init_list->next != thread_mem_init_list) {
      lappendstr(procfunc,"\nstatic void _thread_mem_init(ThreadDatum* _thread) {\n");
      move(thread_mem_init_list->next,thread_mem_init_list->prev,procfunc);
      lappendstr(procfunc,"}\n");
      if (vectorize == 0) goto LAB_001080fc;
    }
    if (thread_cleanup_list->next != thread_cleanup_list) {
      lappendstr(procfunc,"\nstatic void _thread_cleanup(ThreadDatum* _thread) {\n");
      move(thread_cleanup_list->next,thread_cleanup_list->prev,procfunc);
      lappendstr(procfunc,"}\n");
    }
  }
LAB_001080fc:
  if (uip != (List *)0x0) {
    move(uip->next,uip->prev,procfunc);
  }
  if (destructorfunc->next != destructorfunc) {
    pcVar18 = 
    "\n#if 0 /*BBCORE*/\nstatic _destructor(_prop)\n\tProp *_prop; double* _p; Datum* _ppvar; ThreadDatum* _thread;\n{\n\t_thread = (Datum*)0;\n\t_p = prop->param; _ppvar = _prop->dparam;\n{\n"
    ;
    if (vectorize == 0) {
      pcVar18 = 
      "\n#if 0 /*BBCORE*/\nstatic void _destructor(Prop* _prop) {\n\t_p = _prop->param; _ppvar = _prop->dparam;\n{\n"
      ;
    }
    lappendstr(procfunc,pcVar18);
    movelist(destructorfunc->next,destructorfunc->prev,procfunc);
    lappendstr(procfunc,"\n}\n}\n#endif /*BBCORE*/\n");
  }
  if (ldifuslist != (List *)0x0) {
    ldifusreg();
  }
  if (watch_seen_ != 0) {
    lappendstr(procfunc,
               "\nvoid _nrn_watch_check(NrnThread* _nt, Memb_list* _ml) {\n  double* _p; Datum* _ppvar; ThreadDatum* _thread;\n  int* _ni; double v; int _iml, _cntml_padded, _cntml_actual;\n  _cntml_actual = _ml->_nodecount;\n  _cntml_padded = _ml->_nodecount_padded;\n  _ni = _ml->_nodeindices;\n  _thread = _ml->_thread;\n  double * _nt_data = _nt->_data;\n  double * _vec_v = _nt->_actual_v;\n  int stream_id = _nt->stream_id;\n"
              );
    lappendstr(procfunc,
               "\n  #if LAYOUT == 1 /*AoS*/\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n    _p = _ml->_data + _iml*_psize; _ppvar = _ml->_pdata + _iml*_ppsize;\n  #elif LAYOUT == 0 /*SoA*/\n    _p = _ml->_data; _ppvar = _ml->_pdata;\n  /* insert compiler dependent ivdep like pragma */\n  _PRAGMA_FOR_VECTOR_LOOP_\n  _PRAGMA_FOR_STATE_ACC_LOOP_\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n  #else /* LAYOUT > 1 */ /*AoSoA*/\n  #error AoSoA not implemented.\n  for (;;) { /* help clang-format properly indent */\n  #endif\n    v = _vec_v[_ni[_iml]];\n#if NRN_PRCELLSTATE\n    _v_unused = v;\n#endif\n    bool _untriggered = true;\n"
              );
    uVar20 = 1;
    pIVar12 = watch_data_;
    while (pIVar14 = pIVar12->next, pIVar14 != watch_data_) {
      pIVar12 = pIVar14->next->next;
      pSVar11 = (pIVar12->element).sym;
      pcVar18 = items_as_string((pIVar14->element).itm,(pIVar14->next->element).itm);
      lVar24 = pSVar11->subtype;
      sprintf(buf,
              "\n    if (_watch_array(%d)&2 && _untriggered) {\n      if %s {\n        if ((_watch_array(%d)&1) == 0) {\n          _untriggered = false;\n          #if NET_RECEIVE_BUFFERING\n          _net_send_buffering(_ml->_net_send_buffer, 0, _tqitem, -1, _ppvar[1*_STRIDE], t +  0.0 , %s );\n          #else\n          net_send ( _tqitem, -1, (Point_process*) _nt->_vdata[_ppvar[1*_STRIDE]], t +  0.0 , %s ) ;\n          #endif\n        }\n        _watch_array(%d) = 3;\n      }else{\n        _watch_array(%d) = 2;\n      }\n    }\n"
              ,uVar20,pcVar18,uVar20,lVar24,lVar24,uVar20,uVar20);
      lappendstr(procfunc,buf);
      free(pcVar18);
      uVar20 = (ulong)((int)uVar20 + 1);
    }
    buf._4_4_ = SUB84(buf._0_8_,4) & 0xffffff00;
    builtin_strncpy(buf,"  }\n",4);
    lappendstr(procfunc,buf);
    lappendstr(procfunc,
               "\n#if NET_RECEIVE_BUFFERING\n  NetSendBuffer_t* _nsb = _ml->_net_send_buffer;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc wait(stream_id)\n  #pragma acc update self(_nsb->_cnt) if(_nt->compute_gpu)\n  update_net_send_buffer_on_host(_nt, _nsb);\n#endif\n  {int _i;\n  for (_i=0; _i < _nsb->_cnt; ++_i) {\n    net_sem_from_gpu(_nsb->_sendtype[_i], _nsb->_vdata_index[_i],\n      _nsb->_weight_index[_i], _nt->_id, _nsb->_pnt_index[_i],\n      _nsb->_nsb_t[_i], _nsb->_nsb_flag[_i]);\n  }}\n  _nsb->_cnt = 0;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc update device(_nsb->_cnt) if(_nt->compute_gpu)\n#endif\n#endif\n"
              );
    lappendstr(procfunc,"}\n");
  }
  for (lVar24 = 0x41; lVar24 != 0x7b; lVar24 = lVar24 + 1) {
    pLVar16 = symlist[lVar24];
    pLVar15 = pLVar16;
    while (pLVar15 = pLVar15->next, pLVar15 != pLVar16) {
      if ((((pLVar15->element).sym)->subtype & 2) != 0) {
        warn_ignore((pLVar15->element).sym);
        pLVar16 = symlist[lVar24];
      }
    }
  }
  return;
LAB_00106280:
  lVar24 = lVar24 + 1;
  goto LAB_00106195;
}

Assistant:

void parout() {
	int i, j, ioncount, pointercount, gind, emit_check_table_thread;
	Item *q, *q1, *extra_pragma_loop_arg;
	Symbol *s, *sion;
	double d1, d2;

#if BBCORE
	cvode_emit = 0;
#endif

	defs_list = newlist();	/* relates hoc names to c-variables */
	if (brkpnt_exists) {
	    if (vectorize) {
		brkpnt_str_ = "nrn_cur, NULL, nrn_state";
	    }else{
		brkpnt_str_ = "nrn_cur, nrn_jacob, nrn_state";
	    }
	}else{
		brkpnt_str_ = "0, 0, 0";
#if 1 || defined(__MINGW32__)
		/* x86_64-w64-mingw32-gcc passed 0 without zeroing the high 32 bits */
		/* also cygwin64 gcc 4.8.1, so cast to void* universally */
		brkpnt_str_ = "NULL, NULL, NULL";
#endif
	}

	set_suffix();	

	if (artificial_cell && vectorize && (thread_data_index || toplocal_)) {
fprintf(stderr, "Notice: ARTIFICIAL_CELL models that would require thread specific data are not thread safe.\n");	
		vectorize = 0;
	}
	if (point_process) {
		rsuffix = "";
	}else{
		rsuffix = suffix;
	}

	if (point_process && !artificial_cell && net_receive_) {
	  	net_receive_buffering_ = 1;
		emit_net_receive_buffering_code();
	}

	Lappendstr(defs_list, "\
\n#include \"coreneuron/utils/randoms/nrnran123.h\"\
\n#include \"coreneuron/nrnoc/md1redef.h\"\
\n#include \"coreneuron/nrnconf.h\"\
\n#include \"coreneuron/sim/multicore.hpp\"\
\n#include \"coreneuron/nrniv/nrniv_decl.h\"\
\n#include \"coreneuron/utils/ivocvect.hpp\"\
\n#include \"coreneuron/utils/nrnoc_aux.hpp\"\
\n#include \"coreneuron/gpu/nrn_acc_manager.hpp\"\
\n#include \"coreneuron/sim/scopmath/newton_struct.h\"\
\n#include \"coreneuron/sim/scopmath/newton_thread.hpp\"\
\n#include \"coreneuron/sim/scopmath/sparse_thread.hpp\"\
\n#include \"coreneuron/sim/scopmath/ssimplic_thread.hpp\"\
\n#include \"coreneuron/nrnoc/md2redef.h\"\
\n#include \"coreneuron/mechanism/register_mech.hpp\"\
\n#if !NRNGPU\
\n#if !defined(DISABLE_HOC_EXP)\
\n#undef exp\
\n#define exp hoc_Exp\
\n#endif\
\n#endif\n\
");
	if (use_bbcorepointer) {
        Lappendstr(defs_list, "#define _threadargsproto_namespace int _iml, int _cntml_padded, double* _p, coreneuron::Datum* _ppvar, coreneuron::ThreadDatum* _thread, coreneuron::NrnThread* _nt, coreneuron::Memb_list* _ml, double v\n");

		lappendstr(defs_list, "static void bbcore_read(double *, int*, int*, int*, _threadargsproto_namespace);\n");
		lappendstr(defs_list, "static void bbcore_write(double *, int*, int*, int*, _threadargsproto_namespace);\n");
	}

	Lappendstr(defs_list, "namespace coreneuron {\n");
	if (vectorize) {
        /* macros for compiler dependent ivdep like pragma and memory layout. INIT and STATE pragma are same
         * except that sync clause absent because we saw issue only in CaDynamics_E2 */
		lappendstr(defs_list, "\
\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\
\n#include <openacc.h>\
\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], nrn_ion_global_map[0:nrn_ion_global_map_size][0:ion_global_map_member_size], _nt[0:1] _thread_present_) if(_nt->compute_gpu)\")\
\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _nt[0:1], _ml[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_shadow_rhs[0:_nt->shadow_rhs_cnt], _vec_shadow_d[0:_nt->shadow_rhs_cnt], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1]) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"acc parallel loop present(_pnt[0:_pnt_length], _nrb[0:1], _nt[0:1], nrn_threads[0:nrn_nthread]) if(_nt->compute_gpu) async(stream_id)\")\
\n#else\
\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"\")\
\n#endif\
\n \
\n#if !defined(LAYOUT)\
\n/* 1 means AoS, >1 means AoSoA, <= 0 means SOA */\
\n#define LAYOUT 1\
\n#endif\
\n#if LAYOUT >= 1\
\n#define _STRIDE LAYOUT\
\n#else\
\n#define _STRIDE _cntml_padded + _iml\
\n#endif\
\n");

       // if protect is used then do not enable vectorisation with ivdep like pragmas
       // mod2c doesn't have fine grain mechanism to check where PROTECT appears (e.g. via AST)
       // and hence just disable vectorisation at the top level (usage of PROTECT is/would be rare
       // and not critical in mod2c anyway)
       if (protect_include_) {
           extra_pragma_loop_arg = insertstr(defs_list, "\n#define _PRAGMA_FOR_VECTOR_LOOP_\n");
       } else {
           extra_pragma_loop_arg = insertstr(defs_list, "\n"
               "\n#if defined(__ICC) || defined(__INTEL_COMPILER) || defined(__INTEL_LLVM_COMPILER)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ivdep\")"
               "\n#elif defined(__IBMC__) || defined(__IBMCPP__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ibm independent_loop\")"
               "\n#elif defined(__PGI)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"vector\")"
               "\n#elif defined(_CRAYC)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"_CRI ivdep\")"
               "\n#elif defined(__clang__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"clang loop vectorize(enable)\")"
               "\n#elif defined(__GNUC__) || defined(__GNUG__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"GCC ivdep\")"
               "\n#else"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_"
               "\n#endif // _PRAGMA_FOR_VECTOR_LOOP_\n");
       }

	}else{
		Lappendstr(defs_list, "\
\n#undef LAYOUT\
\n#define LAYOUT 1\
\n#define _STRIDE 1\
\n");
	}

	if (net_receive_buffering_) {
		Lappendstr(defs_list, "\
\n\
\n#if !defined(NET_RECEIVE_BUFFERING)\
\n#define NET_RECEIVE_BUFFERING 1\
\n#endif\
\n");
	}

#if 1
	/* for easier profiling, give distinct names to otherwise reused static names */
	sprintf(buf, "\n\
#define nrn_init _nrn_init_%s\n\
#define nrn_cur _nrn_cur_%s\n\
#define _nrn_current _nrn_current_%s\n\
#define nrn_jacob _nrn_jacob_%s\n\
#define nrn_state _nrn_state_%s\n\
#define initmodel initmodel_%s\n\
#define _net_receive _net_receive_%s\n\
#define _net_init _net_init_%s\n\
#define nrn_state_launcher nrn_state%s_launcher\n\
#define nrn_cur_launcher nrn_cur%s_launcher\n\
#define nrn_jacob_launcher nrn_jacob%s_launcher\
", suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix);
	Lappendstr(defs_list, buf);

	if (net_receive_buffering_) {
		sprintf(buf, "\
\n#if NET_RECEIVE_BUFFERING\
\n#define _net_buf_receive _net_buf_receive%s\
\nvoid _net_buf_receive(NrnThread*);\
\n#endif\
\n", suffix);
		Lappendstr(defs_list, buf);
	}

	if (watch_seen_) {
		sprintf(buf,
"\n#define _nrn_watch_check _nrn_watch_check_%s", suffix);
		Lappendstr(defs_list, buf);
	}

	SYMLISTITER {
		Symbol* s = SYM(q);
		/* note that with GLOBFUNCT, FUNCT will be redefined anyway */
		if (s->type == NAME && s->subtype & (PROCED | DERF | KINF)) {
			sprintf(buf, "\n#define %s %s%s", s->name, s->name, suffix);
			Lappendstr(defs_list, buf);
		}
	}
	Lappendstr(defs_list, "\n");
#endif /* distinct names for easier profiling */

	Lappendstr(defs_list, "\n\
#undef _threadargscomma_\n\
#undef _threadargsprotocomma_\n\
#undef _threadargs_\n\
#undef _threadargsproto_\n\
");
	if (vectorize) {
		Lappendstr(defs_list, "\n\
#define _threadargscomma_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v,\n\
#define _threadargsprotocomma_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v,\n\
#define _threadargs_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v\n\
#define _threadargsproto_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v\n\
");
}else{
		Lappendstr(defs_list, "\n\
#define _threadargscomma_ /**/\n\
#define _threadargsprotocomma_ /**/\n\
#define _threadargs_ /**/\n\
#define _threadargsproto_ /**/\n\
");
}

	Lappendstr(defs_list, "\
	/*SUPPRESS 761*/\n\
	/*SUPPRESS 762*/\n\
	/*SUPPRESS 763*/\n\
	/*SUPPRESS 765*/\n\
	");
#if VECTORIZE
    if (vectorize) {
	Sprintf(buf, "/* Thread safe. No static _p or _ppvar. */\n");
    }else
#endif
    {
	Sprintf(buf, "static double *_p; static Datum *_ppvar;\n");
    }
	Lappendstr(defs_list, buf);

	nrndeclare();
	varcount = parraycount = 0;
	declare_p();
	ioncount = iondef(&pointercount); /* first is _nd_area if point process */
	Lappendstr(defs_list, "\n#if MAC\n#if !defined(v)\n#define v _mlhv\n#endif\n#if !defined(h)\n#define h _mlhh\n#endif\n#endif\n");
	Lappendstr(defs_list, "static int hoc_nrnpointerindex = ");
	if (pointercount) {
		q = nrnpointers->next;
		Sprintf(buf, "%d;\n", SYM(q)->used);
	}else{
		Sprintf(buf, "-1;\n");
	}
	Lappendstr(defs_list, buf);
	/*above modified to also count and define pointers*/
	
	if (vectorize) {
		Lappendstr(defs_list, "static ThreadDatum* _extcall_thread;\n");
	}
#if 0
	Lappendstr(defs_list, "/* static variables special to NEURON */\n");
	SYMLISTITER {
		if (SYM(q)->nrntype & NRNSTATIC) {
			Sprintf(buf, "static double %s;\n", SYM(q)->name);
			Lappendstr(defs_list, buf);
		}
	}
#endif

	Lappendstr(defs_list, "/* external NEURON variables */\n");
	int add_celsius  = 0;
	int redefine_nrn_ghk = 0;
	SYMLISTITER {
		s = SYM(q);
		if(strcmp(s->name, "nrn_ghk") == 0 && s->subtype & EXTDEF) {
			add_celsius = 1;
			redefine_nrn_ghk = 1;
		}
		if (s->nrntype & NRNEXTRN) {
			if (strcmp(s->name, "celsius") == 0) {
				add_celsius = 1;
				continue;
			}
			if (strcmp(s->name, "dt") == 0) { continue; }
			if (strcmp(s->name, "t") == 0) { continue; }
			if (s->subtype & ARRAY) {
				Sprintf(buf, "extern double* %s;\n", s->name);
			}else{
				Sprintf(buf, "extern double %s;\n", s->name);
			}
			Lappendstr(defs_list, buf);
			// following are remaining two global variables used as extern from
			// coreneuron side and hence add them to global variable list.
			if (strcmp(s->name, "secondorder") || strcmp(s->name, "pi"))  {
				add_global_var("double", s->name, 0, 0, 0, 0);
            }
        }
    }